

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O0

int IsNear(uint32_t a,uint32_t b,int limit)

{
  int iVar1;
  int delta;
  int k;
  int limit_local;
  uint32_t b_local;
  uint32_t a_local;
  
  k = 0;
  while( true ) {
    if (3 < k) {
      return 1;
    }
    iVar1 = (a >> ((byte)(k << 3) & 0x1f) & 0xff) - (b >> ((byte)(k << 3) & 0x1f) & 0xff);
    if ((limit <= iVar1) || (iVar1 <= -limit)) break;
    k = k + 1;
  }
  return 0;
}

Assistant:

static int IsNear(uint32_t a, uint32_t b, int limit) {
  int k;
  for (k = 0; k < 4; ++k) {
    const int delta =
        (int)((a >> (k * 8)) & 0xff) - (int)((b >> (k * 8)) & 0xff);
    if (delta >= limit || delta <= -limit) {
      return 0;
    }
  }
  return 1;
}